

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

int Mio_CheckPins(Mio_Pin_t *pPin1,Mio_Pin_t *pPin2)

{
  int iVar1;
  
  if (pPin2 == (Mio_Pin_t *)0x0 || pPin1 == (Mio_Pin_t *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if ((((((pPin1->dLoadInput == pPin2->dLoadInput) &&
           (!NAN(pPin1->dLoadInput) && !NAN(pPin2->dLoadInput))) &&
          (pPin1->dLoadMax == pPin2->dLoadMax)) &&
         ((!NAN(pPin1->dLoadMax) && !NAN(pPin2->dLoadMax) &&
          (pPin1->dDelayBlockRise == pPin2->dDelayBlockRise)))) &&
        ((!NAN(pPin1->dDelayBlockRise) && !NAN(pPin2->dDelayBlockRise) &&
         ((pPin1->dDelayFanoutRise == pPin2->dDelayFanoutRise &&
          (!NAN(pPin1->dDelayFanoutRise) && !NAN(pPin2->dDelayFanoutRise))))))) &&
       ((pPin1->dDelayBlockFall == pPin2->dDelayBlockFall &&
        (!NAN(pPin1->dDelayBlockFall) && !NAN(pPin2->dDelayBlockFall))))) {
      return -(uint)(pPin2->dDelayFanoutFall == pPin1->dDelayFanoutFall) & 1;
    }
  }
  return iVar1;
}

Assistant:

int Mio_CheckPins( Mio_Pin_t * pPin1, Mio_Pin_t * pPin2 )
{
    if ( pPin1 == NULL || pPin2 == NULL )
        return 1;
    if ( pPin1->dLoadInput != pPin2->dLoadInput )
        return 0;
    if ( pPin1->dLoadMax != pPin2->dLoadMax )
        return 0;
    if ( pPin1->dDelayBlockRise != pPin2->dDelayBlockRise )
        return 0;
    if ( pPin1->dDelayFanoutRise != pPin2->dDelayFanoutRise )
        return 0;
    if ( pPin1->dDelayBlockFall != pPin2->dDelayBlockFall )
        return 0;
    if ( pPin1->dDelayFanoutFall != pPin2->dDelayFanoutFall )
        return 0;
    return 1;
}